

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_extension_operator.cpp
# Opt level: O1

void __thiscall
duckdb::LogicalExtensionOperator::Serialize(LogicalExtensionOperator *this,Serializer *serializer)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  (*(this->super_LogicalOperator)._vptr_LogicalOperator[0x11])(local_30,this);
  (*serializer->_vptr_Serializer[2])(serializer,200,"extension_name");
  (*serializer->_vptr_Serializer[0x1c])(serializer,local_30);
  (*serializer->_vptr_Serializer[3])(serializer);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

void LogicalExtensionOperator::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WriteProperty(200, "extension_name", GetExtensionName());
}